

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

void obj_extract_self(obj *obj)

{
  obj *obj_local;
  
  switch(obj->where) {
  case '\0':
    break;
  case '\x01':
    remove_object(obj);
    break;
  case '\x02':
    extract_nobj(obj,&((obj->v).v_nexthere)->cobj);
    container_weight((obj->v).v_nexthere);
    break;
  case '\x03':
    freeinv(obj);
    break;
  case '\x04':
    extract_nobj(obj,&((obj->v).v_ocarry)->minvent);
    break;
  case '\x05':
    extract_nobj(obj,&obj->olev->buriedobjlist);
    break;
  case '\x06':
    extract_nobj(obj,&obj->olev->billobjs);
    break;
  case '\a':
    extract_nobj(obj,&magic_chest_objs);
    break;
  default:
    panic("obj_extract_self");
  }
  return;
}

Assistant:

void obj_extract_self(struct obj *obj)
{
    switch (obj->where) {
	case OBJ_FREE:
	    break;
	case OBJ_FLOOR:
	    remove_object(obj);
	    break;
	case OBJ_CONTAINED:
	    extract_nobj(obj, &obj->ocontainer->cobj);
	    container_weight(obj->ocontainer);
	    break;
	case OBJ_INVENT:
	    freeinv(obj);
	    break;
	case OBJ_MINVENT:
	    extract_nobj(obj, &obj->ocarry->minvent);
	    break;
	case OBJ_BURIED:
	    extract_nobj(obj, &obj->olev->buriedobjlist);
	    break;
	case OBJ_ONBILL:
	    extract_nobj(obj, &obj->olev->billobjs);
	    break;
	case OBJ_MAGIC_CHEST:
	    extract_nobj(obj, &magic_chest_objs);
	    break;
	default:
	    panic("obj_extract_self");
	    break;
    }
}